

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobVerificationManager.cxx
# Opt level: O0

vector<cmGlobCacheEntry,_std::allocator<cmGlobCacheEntry>_> * __thiscall
cmGlobVerificationManager::GetCacheEntries
          (vector<cmGlobCacheEntry,_std::allocator<cmGlobCacheEntry>_> *__return_storage_ptr__,
          cmGlobVerificationManager *this)

{
  bool bVar1;
  type *ptVar2;
  type *ptVar3;
  undefined1 local_d0 [8];
  CacheEntryValue v;
  undefined1 local_88 [8];
  CacheEntryKey k;
  pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>
  *i;
  const_iterator __end1;
  const_iterator __begin1;
  CacheEntryMap *__range1;
  cmGlobVerificationManager *this_local;
  vector<cmGlobCacheEntry,_std::allocator<cmGlobCacheEntry>_> *entries;
  
  std::vector<cmGlobCacheEntry,_std::allocator<cmGlobCacheEntry>_>::vector(__return_storage_ptr__);
  __end1 = std::
           map<cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue,_std::less<cmGlobVerificationManager::CacheEntryKey>,_std::allocator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>_>
           ::begin(&this->Cache);
  i = (pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>
       *)std::
         map<cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue,_std::less<cmGlobVerificationManager::CacheEntryKey>,_std::allocator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>_>
         ::end(&this->Cache);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&i), bVar1) {
    k.Expression.field_2._8_8_ =
         std::
         _Rb_tree_const_iterator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>
         ::operator*(&__end1);
    ptVar2 = std::
             get<0ul,cmGlobVerificationManager::CacheEntryKey_const,cmGlobVerificationManager::CacheEntryValue>
                       ((pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>
                         *)k.Expression.field_2._8_8_);
    CacheEntryKey::CacheEntryKey((CacheEntryKey *)local_88,ptVar2);
    ptVar3 = std::
             get<1ul,cmGlobVerificationManager::CacheEntryKey_const,cmGlobVerificationManager::CacheEntryValue>
                       ((pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>
                         *)k.Expression.field_2._8_8_);
    CacheEntryValue::CacheEntryValue((CacheEntryValue *)local_d0,ptVar3);
    if ((local_d0[0] & 1U) != 0) {
      std::vector<cmGlobCacheEntry,std::allocator<cmGlobCacheEntry>>::
      emplace_back<bool_const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                ((vector<cmGlobCacheEntry,std::allocator<cmGlobCacheEntry>> *)__return_storage_ptr__
                 ,(bool *)local_88,(bool *)(local_88 + 1),(bool *)(local_88 + 2),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&k,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&k.Relative.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&v);
    }
    CacheEntryValue::~CacheEntryValue((CacheEntryValue *)local_d0);
    CacheEntryKey::~CacheEntryKey((CacheEntryKey *)local_88);
    std::
    _Rb_tree_const_iterator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmGlobCacheEntry> cmGlobVerificationManager::GetCacheEntries()
  const
{
  std::vector<cmGlobCacheEntry> entries;
  for (auto const& i : this->Cache) {
    CacheEntryKey k = std::get<0>(i);
    CacheEntryValue v = std::get<1>(i);
    if (v.Initialized) {
      entries.emplace_back(k.Recurse, k.ListDirectories, k.FollowSymlinks,
                           k.Relative, k.Expression, v.Files);
    }
  }
  return entries;
}